

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O2

Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
yaml::ParserContext::getNextEvent_abi_cxx11_
          (Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ParserContext *this)

{
  int iVar1;
  YamlEventPtr event_holder;
  yaml_event_t event;
  string local_c8;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  char local_98 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_90;
  yaml_event_t local_80;
  
  iVar1 = yaml_parser_parse(&this->parser_,&local_80);
  if (iVar1 == 0) {
    format_abi_cxx11_(&local_c8,"Error parsing yaml %d@%d: %s",
                      (ulong)(uint)(this->parser_).problem_mark.line,
                      (ulong)(uint)(this->parser_).problem_mark.column,(this->parser_).problem);
    local_a8 = (undefined1  [8])local_98;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
      aStack_90._M_allocated_capacity = local_c8.field_2._8_8_;
    }
    else {
      local_a8 = (undefined1  [8])local_c8._M_dataplus._M_p;
    }
    local_a0._M_p = (pointer)local_c8._M_string_length;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  else {
    local_c8._M_dataplus._M_p = (pointer)yaml_event_delete;
    local_c8._M_string_length = (size_type)&local_80;
    YamlEvent::YamlEvent((YamlEvent *)local_a8,&local_80);
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(YamlEvent *)local_a8);
    std::__cxx11::string::~string((string *)&local_a0);
    std::unique_ptr<yaml_event_s,_void_(*)(yaml_event_s_*)>::~unique_ptr
              ((unique_ptr<yaml_event_s,_void_(*)(yaml_event_s_*)> *)&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<YamlEvent, std::string> getNextEvent() {
		yaml_event_t event;
		if (!yaml_parser_parse(&parser_, &event)) {
			return Unexpected(format("Error parsing yaml %d@%d: %s",
				(int)parser_.problem_mark.line, (int)parser_.problem_mark.column,
				parser_.problem));
		}
		using YamlEventPtr = std::unique_ptr<yaml_event_t, decltype(&yaml_event_delete)>;
		const auto event_holder = YamlEventPtr(&event, &yaml_event_delete);

		return YamlEvent(event);
	}